

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nnls.h
# Opt level: O0

bool __thiscall
Eigen::NNLS<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::solve
          (NNLS<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *this,ColVectorType *b,Heuristic heuristic
          )

{
  float fVar1;
  bool bVar2;
  Index IVar3;
  Index idx_00;
  DenseCoeffsBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>,_1> *pDVar4;
  Scalar *pSVar5;
  Scalar *pSVar6;
  Scalar SVar7;
  float fVar8;
  Index idx_1;
  Index i_1;
  Scalar t;
  Index idx;
  Index i;
  Index remIdx;
  Scalar alpha;
  bool feasable;
  Product<Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>
  local_38;
  Heuristic local_24;
  MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *pMStack_20;
  Heuristic heuristic_local;
  ColVectorType *b_local;
  NNLS<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *this_local;
  
  this->_num_ls = 0;
  local_24 = heuristic;
  pMStack_20 = (MatrixBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)b;
  b_local = (ColVectorType *)this;
  DenseBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_> *)&this->_x);
  PermutationBase<Eigen::PermutationMatrix<-1,_-1,_long>_>::setIdentity
            ((PermutationBase<Eigen::PermutationMatrix<_1,__1,_long>_> *)&this->_P);
  this->_Np = 0;
  _alpha = DenseBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::transpose
                     ((DenseBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_> *)&this->_A);
  local_38 = MatrixBase<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>>>::operator*
                       ((MatrixBase<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>>> *)&alpha,
                        pMStack_20);
  Matrix<float,-1,1,0,-1,1>::operator=
            ((Matrix<float,_1,1,0,_1,1> *)&this->_Atb,
             (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_0>_>
              *)&local_38);
  do {
    _updateGradient(this);
    IVar3 = PlainObjectBase<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>::cols
                      (&(this->_A).super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>);
    if ((IVar3 == this->_Np) || (SVar7 = _max_Z(this,&this->_w), SVar7 - this->_epsilon < 0.0)) {
      return true;
    }
    if (local_24 == MAX_DESCENT) {
      idx_00 = _argmax_Z(this,&this->_w);
      _addToP(this,idx_00);
    }
    while( true ) {
      if ((0 < this->_max_iter) && (this->_max_iter <= this->_num_ls)) {
        return false;
      }
      _solveLS_P(this,(ColVectorType *)pMStack_20);
      bVar2 = true;
      remIdx._0_4_ = std::numeric_limits<float>::max();
      for (idx = 0; idx < this->_Np; idx = idx + 1) {
        pDVar4 = (DenseCoeffsBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>,_1> *)
                 PermutationMatrix<-1,_-1,_long>::indices(&this->_P);
        pSVar5 = DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_1>::operator()(pDVar4,idx);
        IVar3 = *pSVar5;
        pSVar6 = DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)&this->_y,
                            IVar3);
        if (*pSVar6 <= 0.0 && *pSVar6 != 0.0) {
          pSVar6 = DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)&this->_x
                              ,IVar3);
          fVar8 = *pSVar6;
          pSVar6 = DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)&this->_y
                              ,IVar3);
          fVar1 = *pSVar6;
          pSVar6 = DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)&this->_x
                              ,IVar3);
          fVar8 = -fVar8 / (fVar1 - *pSVar6);
          if (fVar8 < (float)remIdx) {
            i = idx;
            bVar2 = false;
            remIdx._0_4_ = fVar8;
          }
        }
      }
      if (bVar2) break;
      for (idx_1 = 0; idx_1 < this->_Np; idx_1 = idx_1 + 1) {
        pDVar4 = (DenseCoeffsBase<Eigen::Matrix<long,__1,_1,_0,__1,_1>,_1> *)
                 PermutationMatrix<-1,_-1,_long>::indices(&this->_P);
        pSVar5 = DenseCoeffsBase<Eigen::Matrix<long,_-1,_1,_0,_-1,_1>,_1>::operator()(pDVar4,idx_1);
        IVar3 = *pSVar5;
        pSVar6 = DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)&this->_y,
                            IVar3);
        fVar8 = *pSVar6;
        pSVar6 = DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)&this->_x,
                            IVar3);
        fVar1 = *pSVar6;
        pSVar6 = DenseCoeffsBase<Eigen::Matrix<float,_-1,_1,_0,_-1,_1>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>,_1> *)&this->_x,
                            IVar3);
        *pSVar6 = (float)remIdx * (fVar8 - fVar1) + *pSVar6;
      }
      _remFromP(this,i);
    }
    Matrix<float,_-1,_1,_0,_-1,_1>::operator=(&this->_x,&this->_y);
  } while( true );
}

Assistant:

bool NNLS<MatrixType>::solve(const ColVectorType &b, Heuristic heuristic)
{
#ifdef EIGEN3_NNLS_DEBUG
  std::cerr << "NNLS(): Start..." << std::endl;
  _QR.setZero(); _qrCoeffs.setZero();
#endif

  // Initialize solver
  _num_ls = 0; _x.setZero();

  // Together with _Np, P separates the space of coefficients into a active (Z) and passive (P)
  // set. The first _Np elements form the passive set P and the remaining elements form the
  // active set Z.
  _P.setIdentity(); _Np = 0;

  // Precompute A^T*b
  _Atb = _A.transpose() * b;

  // OUTER LOOP
  while (true)
  {
    // Update gradient _w
    _updateGradient();

    // Check if system is solved:
    if ((_A.cols()==_Np) || ((_max_Z(_w)-_epsilon)<0))
      return true;

    switch (heuristic) {
    // find index of max descent and add it to P
    case MAX_DESCENT:
        _addToP(_argmax_Z(_w));
        break;
    }

    // INNER LOOP
    while (true)
    {
      // Check if max. number of iterations is reached
      if ( (0 < _max_iter) && (int(_num_ls) >= _max_iter) )
        return false;

      // Solve LS problem in P only, this step is rather trivial as _addToP & _remFromP
      // updates the QR decomposition of A^P.
      _solveLS_P(b);

      // Check feasability...
      bool feasable = true;
      Scalar alpha = std::numeric_limits<Scalar>::max(); Index remIdx;
      for (Index i=0; i<_Np; i++) {
        Index idx = _P.indices()(i);
        if (_y(idx) < 0) {
          // t shoudl always be in [0,1].
          Scalar t = -_x(idx)/(_y(idx)-_x(idx));
          if (alpha > t) {
            alpha = t;
            remIdx = i;
            feasable = false;
          }
        }
      }

      // If solution is feasable, exit to outer loop
      if (feasable) {
        _x = _y;
        break;
      }

      // Infeasable solution -> interpolate to feasable one
      for (Index i=0; i<_Np; i++) {
        Index idx = _P.indices()(i);
        _x(idx) += alpha * (_y(idx) - _x(idx));
      }

      // Remove these indices from P and update QR decomposition
      _remFromP(remIdx);
    }
  }
}